

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDCLoader.cpp
# Opt level: O1

void __thiscall Assimp::MDCImporter::ValidateSurfaceHeader(MDCImporter *this,Surface *pcSurf)

{
  uint32_t uVar1;
  uint uVar2;
  runtime_error *this_00;
  ulong uVar4;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  ulong uVar3;
  
  uVar2 = (*(int *)&this->pcHeader - (int)pcSurf) + this->fileSize;
  uVar3 = (ulong)uVar2;
  uVar4 = (ulong)pcSurf->ulNumVertices;
  if ((ulong)pcSurf->ulOffsetBaseVerts + uVar4 * 8 <= uVar3) {
    uVar1 = pcSurf->ulNumCompFrames;
    if (((((uVar1 == 0) || ((ulong)pcSurf->ulOffsetCompVerts + uVar4 * 4 <= uVar3)) &&
         ((ulong)pcSurf->ulOffsetTriangles + (ulong)pcSurf->ulNumTriangles * 0xc <= uVar3)) &&
        (((ulong)pcSurf->ulOffsetTexCoords + uVar4 * 8 <= uVar3 &&
         ((ulong)pcSurf->ulNumShaders * 0x44 + (ulong)pcSurf->ulOffsetShaders <= uVar3)))) &&
       ((pcSurf->ulNumBaseFrames * 2 + pcSurf->ulOffsetFrameBaseFrames <= uVar2 &&
        ((uVar1 == 0 || (uVar1 * 2 + pcSurf->ulOffsetFrameCompFrames <= uVar2)))))) {
      return;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             "Some of the offset values in the MDC surface header are invalid and point somewhere behind the file."
             ,"");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00900168;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MDCImporter::ValidateSurfaceHeader(BE_NCONST MDC::Surface* pcSurf)
{
    AI_SWAP4(pcSurf->ulFlags);
    AI_SWAP4(pcSurf->ulNumCompFrames);
    AI_SWAP4(pcSurf->ulNumBaseFrames);
    AI_SWAP4(pcSurf->ulNumShaders);
    AI_SWAP4(pcSurf->ulNumVertices);
    AI_SWAP4(pcSurf->ulNumTriangles);
    AI_SWAP4(pcSurf->ulOffsetTriangles);
    AI_SWAP4(pcSurf->ulOffsetTexCoords);
    AI_SWAP4(pcSurf->ulOffsetBaseVerts);
    AI_SWAP4(pcSurf->ulOffsetCompVerts);
    AI_SWAP4(pcSurf->ulOffsetFrameBaseFrames);
    AI_SWAP4(pcSurf->ulOffsetFrameCompFrames);
    AI_SWAP4(pcSurf->ulOffsetEnd);

    const unsigned int iMax = this->fileSize - (unsigned int)((int8_t*)pcSurf-(int8_t*)pcHeader);

    if (pcSurf->ulOffsetBaseVerts + pcSurf->ulNumVertices * sizeof(MDC::BaseVertex)         > iMax ||
        (pcSurf->ulNumCompFrames && pcSurf->ulOffsetCompVerts + pcSurf->ulNumVertices * sizeof(MDC::CompressedVertex)   > iMax) ||
        pcSurf->ulOffsetTriangles + pcSurf->ulNumTriangles * sizeof(MDC::Triangle)          > iMax ||
        pcSurf->ulOffsetTexCoords + pcSurf->ulNumVertices * sizeof(MDC::TexturCoord)        > iMax ||
        pcSurf->ulOffsetShaders + pcSurf->ulNumShaders * sizeof(MDC::Shader)                > iMax ||
        pcSurf->ulOffsetFrameBaseFrames + pcSurf->ulNumBaseFrames * 2                       > iMax ||
        (pcSurf->ulNumCompFrames && pcSurf->ulOffsetFrameCompFrames + pcSurf->ulNumCompFrames * 2   > iMax))
    {
        throw DeadlyImportError("Some of the offset values in the MDC surface header "
            "are invalid and point somewhere behind the file.");
    }
}